

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

bool __thiscall cppcms::widgets::regex_field::validate(regex_field *this)

{
  undefined1 *this_00;
  uint uVar1;
  _func_int *p_Var2;
  bool bVar3;
  byte bVar4;
  string local_40;
  
  this_00 = &(this->super_text).super_base_html_input.field_0x30;
  bVar3 = base_text::validate((base_text *)this_00);
  if (bVar3) {
    p_Var2 = (this->super_text).super_base_html_input._vptr_base_html_input[-3];
    uVar1 = *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2);
    if ((uVar1 & 2) == 0) {
      *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2) =
           uVar1 & 0xfffffffc;
    }
    else {
      base_text::value_abi_cxx11_(&local_40,(base_text *)this_00);
      bVar4 = booster::regex::match
                        (&(this->super_text).super_base_html_input.field_0x88,
                         local_40._M_dataplus._M_p,
                         (int)local_40._M_string_length + (int)local_40._M_dataplus._M_p);
      *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2) =
           *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2) &
           0xfffffffe | (uint)bVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    bVar3 = (bool)((&(this->super_text).super_base_html_input.field_0x1f0)
                   [(long)(this->super_text).super_base_html_input._vptr_base_html_input[-3]] & 1);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool regex_field::validate()
{
	if(!text::validate())
		return false;
	valid(set() && booster::regex_match(value(),expression_));
	return valid();
}